

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O1

int secp256k1_ecmult_wnaf(int *wnaf,int len,secp256k1_scalar *a,int w)

{
  uint64_t *puVar1;
  secp256k1_fe *psVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  byte bVar147;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  uint64_t uVar176;
  uint64_t uVar177;
  uint64_t uVar178;
  uint uVar179;
  int iVar180;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  int extraout_EAX_04;
  int extraout_EAX_05;
  secp256k1_gej *psVar181;
  secp256k1_gej *psVar182;
  ulong uVar183;
  void *pvVar184;
  undefined4 in_register_0000000c;
  uint extraout_EDX;
  ulong extraout_RDX;
  secp256k1_ge *a_00;
  secp256k1_gej *unaff_RBX;
  ulong uVar185;
  ulong uVar186;
  ulong unaff_RBP;
  undefined4 in_register_00000034;
  secp256k1_gej *a_01;
  secp256k1_gej *r;
  secp256k1_gej *a_02;
  secp256k1_gej *a_03;
  ulong uVar187;
  ulong uVar188;
  ulong uVar189;
  ulong uVar190;
  secp256k1_scalar *unaff_R12;
  uint uVar191;
  secp256k1_gej *unaff_R13;
  secp256k1_fe *unaff_R14;
  uint count;
  secp256k1_gej *unaff_R15;
  bool bVar192;
  secp256k1_scalar s;
  undefined1 auStack_2d8 [104];
  ulong uStack_270;
  ulong uStack_268;
  ulong uStack_260;
  ulong uStack_258;
  ulong uStack_250;
  undefined1 auStack_248 [56];
  uint64_t uStack_210;
  uint64_t uStack_208;
  uint64_t uStack_200;
  uint64_t uStack_1f8;
  int iStack_1f0;
  undefined1 auStack_1e8 [56];
  uint64_t uStack_1b0;
  uint64_t uStack_1a8;
  uint64_t uStack_1a0;
  uint64_t uStack_198;
  int iStack_190;
  int iStack_18c;
  ulong uStack_188;
  secp256k1_gej *psStack_180;
  undefined1 auStack_178 [104];
  ulong uStack_110;
  ulong uStack_108;
  ulong uStack_100;
  uint64_t uStack_f8;
  undefined8 uStack_f0;
  undefined1 auStack_e8 [96];
  code *pcStack_88;
  secp256k1_gej *psStack_78;
  secp256k1_fe *psStack_70;
  int local_64;
  int *local_60;
  uint64_t local_58;
  uint64_t uStack_50;
  uint64_t local_48;
  uint64_t uStack_40;
  
  a_01 = (secp256k1_gej *)CONCAT44(in_register_00000034,len);
  psVar181 = (secp256k1_gej *)CONCAT44(in_register_0000000c,w);
  local_60 = wnaf;
  if (wnaf == (int *)0x0) {
LAB_001512e4:
    psStack_70 = (secp256k1_fe *)0x1512e9;
    secp256k1_ecmult_wnaf_cold_5();
LAB_001512e9:
    psStack_70 = (secp256k1_fe *)0x1512ee;
    secp256k1_ecmult_wnaf_cold_4();
    a = unaff_R12;
LAB_001512ee:
    psStack_70 = (secp256k1_fe *)0x1512f3;
    secp256k1_ecmult_wnaf_cold_3();
  }
  else {
    unaff_R12 = a;
    if (a == (secp256k1_scalar *)0x0) goto LAB_001512e9;
    unaff_RBX = (secp256k1_gej *)(ulong)(uint)w;
    if (w < 2) goto LAB_001512ee;
    unaff_RBP = (ulong)(uint)len;
    unaff_R15 = (secp256k1_gej *)0x0;
    a_01 = (secp256k1_gej *)0x0;
    psStack_70 = (secp256k1_fe *)0x1511d4;
    memset(wnaf,0,(ulong)(uint)len << 2);
    local_48 = a->d[2];
    uStack_40 = a->d[3];
    local_58 = a->d[0];
    uStack_50 = a->d[1];
    local_64 = 1;
    if ((long)a->d[3] < 0) {
      a_01 = (secp256k1_gej *)&stack0xffffffffffffffa8;
      psStack_70 = (secp256k1_fe *)0x151206;
      wnaf = (int *)a_01;
      secp256k1_scalar_negate((secp256k1_scalar *)a_01,(secp256k1_scalar *)a_01);
      local_64 = -1;
    }
    if (len < 1) {
      psVar181 = (secp256k1_gej *)CONCAT71((int7)((ulong)psVar181 >> 8),1);
      iVar180 = 0;
    }
    else {
      unaff_R14 = (secp256k1_fe *)(ulong)(w - 1U);
      a = (secp256k1_scalar *)0x0;
      psVar181 = (secp256k1_gej *)0xffffffff;
      unaff_R13 = (secp256k1_gej *)0x0;
      do {
        psVar182 = unaff_R13;
        uVar191 = (uint)psVar182;
        uVar186 = *(ulong *)((long)&stack0xffffffffffffffa8 + ((ulong)psVar182 >> 6) * 8);
        if ((uint)((uVar186 >> ((ulong)psVar182 & 0x3f) & 1) != 0) == (uint)a) {
          uVar191 = uVar191 + 1;
          psVar182 = psVar181;
        }
        else {
          count = len - uVar191;
          if (w <= (int)(len - uVar191)) {
            count = w;
          }
          wnaf = (int *)&stack0xffffffffffffffa8;
          psStack_70 = (secp256k1_fe *)0x151263;
          a_01 = psVar182;
          uVar179 = secp256k1_scalar_get_bits_var((secp256k1_scalar *)wnaf,uVar191,count);
          uVar179 = uVar179 + (uint)a;
          bVar192 = (uVar179 >> (w - 1U & 0x1f) & 1) != 0;
          a = (secp256k1_scalar *)(ulong)bVar192;
          uVar186 = (ulong)(int)uVar191;
          local_60[uVar186] = (uVar179 - ((uint)bVar192 << ((byte)w & 0x1f))) * local_64;
          uVar191 = count + uVar191;
        }
        unaff_R13 = (secp256k1_gej *)(ulong)uVar191;
        psVar181 = psVar182;
      } while ((int)uVar191 < len);
      psVar181 = (secp256k1_gej *)CONCAT71((int7)(uVar186 >> 8),(int)a == 0);
      iVar180 = (int)psVar182 + 1;
      unaff_R15 = unaff_R13;
    }
    if ((char)psVar181 != '\0') {
      if ((int)unaff_R15 < 0x100) {
        do {
          psVar181 = *(secp256k1_gej **)
                      ((long)&stack0xffffffffffffffa8 + ((ulong)unaff_R15 >> 6) * 8);
          if (((ulong)psVar181 >> ((ulong)unaff_R15 & 0x3f) & 1) != 0) {
            psStack_70 = (secp256k1_fe *)0x1512e4;
            secp256k1_ecmult_wnaf_cold_2();
            unaff_R12 = a;
            goto LAB_001512e4;
          }
          uVar191 = (int)unaff_R15 + 1;
          unaff_R15 = (secp256k1_gej *)(ulong)uVar191;
        } while (uVar191 != 0x100);
      }
      return iVar180;
    }
  }
  psStack_70 = (secp256k1_fe *)secp256k1_ecmult_table_get_ge_storage;
  secp256k1_ecmult_wnaf_cold_1();
  psStack_78 = unaff_RBX;
  psStack_70 = unaff_R14;
  if ((extraout_RDX & 1) == 0) {
    pcStack_88 = (code *)0x1513bd;
    secp256k1_ecmult_table_get_ge_storage_cold_4();
    psVar182 = (secp256k1_gej *)wnaf;
LAB_001513bd:
    pcStack_88 = (code *)0x1513c2;
    secp256k1_ecmult_table_get_ge_storage_cold_1();
LAB_001513c2:
    pcStack_88 = (code *)0x1513c7;
    secp256k1_ecmult_table_get_ge_storage_cold_3();
  }
  else {
    uVar191 = (uint)extraout_RDX;
    psVar182 = (secp256k1_gej *)wnaf;
    if ((int)uVar191 < -0x3fff) goto LAB_001513bd;
    if (0x3fff < (int)uVar191) goto LAB_001513c2;
    if (0 < (int)uVar191) {
      secp256k1_ge_from_storage
                ((secp256k1_ge *)wnaf,
                 (secp256k1_ge_storage *)((long)&a_01->x + (ulong)(uVar191 - 1 >> 1) * 0x40));
      return extraout_EAX;
    }
    a_01 = (secp256k1_gej *)((long)&a_01->x + (ulong)(~uVar191 >> 1) * 0x40);
    pcStack_88 = (code *)0x151351;
    secp256k1_ge_from_storage((secp256k1_ge *)wnaf,(secp256k1_ge_storage *)a_01);
    unaff_R14 = &((secp256k1_gej *)wnaf)->y;
    pcStack_88 = (code *)0x15135d;
    psVar182 = (secp256k1_gej *)unaff_R14;
    secp256k1_fe_verify(unaff_R14);
    unaff_RBX = (secp256k1_gej *)wnaf;
    if ((((secp256k1_gej *)wnaf)->y).magnitude < 2) {
      uVar176 = (((secp256k1_gej *)wnaf)->y).n[1];
      uVar177 = (((secp256k1_gej *)wnaf)->y).n[2];
      uVar178 = (((secp256k1_gej *)wnaf)->y).n[3];
      (((secp256k1_gej *)wnaf)->y).n[0] = 0x3ffffbfffff0bc - (((secp256k1_gej *)wnaf)->y).n[0];
      (((secp256k1_gej *)wnaf)->y).n[1] = 0x3ffffffffffffc - uVar176;
      (((secp256k1_gej *)wnaf)->y).n[2] = 0x3ffffffffffffc - uVar177;
      (((secp256k1_gej *)wnaf)->y).n[3] = 0x3ffffffffffffc - uVar178;
      (((secp256k1_gej *)wnaf)->y).n[4] = 0x3fffffffffffc - (((secp256k1_gej *)wnaf)->y).n[4];
      (((secp256k1_gej *)wnaf)->y).magnitude = 2;
      (((secp256k1_gej *)wnaf)->y).normalized = 0;
      secp256k1_fe_verify(unaff_R14);
      return extraout_EAX_00;
    }
  }
  pcStack_88 = secp256k1_gej_add_zinv_var;
  secp256k1_ecmult_table_get_ge_storage_cold_2();
  r = a_01;
  auStack_e8._56_8_ = unaff_RBX;
  auStack_e8._64_8_ = a;
  auStack_e8._72_8_ = unaff_R13;
  auStack_e8._80_8_ = unaff_R14;
  auStack_e8._88_8_ = unaff_R15;
  pcStack_88 = (code *)unaff_RBP;
  secp256k1_ge_verify(a_00);
  secp256k1_fe_verify(&psVar181->x);
  if (a_01->infinity == 0) {
    if (a_00->infinity != 0) {
      pvVar184 = memcpy(psVar182,a_01,0x98);
      return (int)pvVar184;
    }
    a_02 = (secp256k1_gej *)&a_01->z;
    a_03 = (secp256k1_gej *)(auStack_178 + 0x60);
    r = a_02;
    secp256k1_fe_mul((secp256k1_fe *)a_03,(secp256k1_fe *)a_02,&psVar181->x);
    secp256k1_fe_verify((secp256k1_fe *)a_03);
    if (8 < (int)uStack_f0) goto LAB_0015263a;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = auStack_178._96_8_ * 2;
    auVar99._8_8_ = 0;
    auVar99._0_8_ = uStack_100;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = uStack_110 * 2;
    auVar100._8_8_ = 0;
    auVar100._0_8_ = uStack_108;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uStack_f8;
    auVar101._8_8_ = 0;
    auVar101._0_8_ = uStack_f8;
    uVar188 = SUB168(auVar25 * auVar101,0);
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar188 & 0xfffffffffffff;
    auVar23 = auVar24 * auVar100 + auVar23 * auVar99 + auVar26 * ZEXT816(0x1000003d10);
    uVar186 = auVar23._0_8_;
    auStack_1e8._0_8_ = uVar186 & 0xfffffffffffff;
    auVar155._8_8_ = 0;
    auVar155._0_8_ = uVar186 >> 0x34 | auVar23._8_8_ << 0xc;
    uVar186 = uStack_f8 * 2;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = auStack_178._96_8_;
    auVar102._8_8_ = 0;
    auVar102._0_8_ = uVar186;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = uStack_110 * 2;
    auVar103._8_8_ = 0;
    auVar103._0_8_ = uStack_100;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uStack_108;
    auVar104._8_8_ = 0;
    auVar104._0_8_ = uStack_108;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = uVar188 >> 0x34 | SUB168(auVar25 * auVar101,8) << 0xc;
    auVar23 = auVar27 * auVar102 + auVar155 + auVar28 * auVar103 + auVar29 * auVar104 +
              auVar30 * ZEXT816(0x1000003d10);
    auStack_248._48_8_ = auVar23._0_8_;
    auVar156._8_8_ = 0;
    auVar156._0_8_ = (ulong)auStack_248._48_8_ >> 0x34 | auVar23._8_8_ << 0xc;
    auStack_248._0_8_ = (auStack_248._48_8_ & 0xfffffffffffff) >> 0x30;
    auStack_248._48_8_ = auStack_248._48_8_ & 0xffffffffffff;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = auStack_178._96_8_;
    auVar105._8_8_ = 0;
    auVar105._0_8_ = auStack_178._96_8_;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = uStack_110;
    auVar106._8_8_ = 0;
    auVar106._0_8_ = uVar186;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = uStack_108 * 2;
    auVar107._8_8_ = 0;
    auVar107._0_8_ = uStack_100;
    auVar23 = auVar32 * auVar106 + auVar156 + auVar33 * auVar107;
    uVar188 = auVar23._0_8_;
    auVar158._8_8_ = 0;
    auVar158._0_8_ = uVar188 >> 0x34 | auVar23._8_8_ << 0xc;
    auVar108._8_8_ = 0;
    auVar108._0_8_ = (uVar188 & 0xfffffffffffff) << 4 | auStack_248._0_8_;
    auVar23 = auVar31 * auVar105 + ZEXT816(0x1000003d1) * auVar108;
    uVar188 = auVar23._0_8_;
    auStack_178._48_8_ = uVar188 & 0xfffffffffffff;
    auVar157._8_8_ = 0;
    auVar157._0_8_ = uVar188 >> 0x34 | auVar23._8_8_ << 0xc;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = auStack_178._96_8_ * 2;
    auVar109._8_8_ = 0;
    auVar109._0_8_ = uStack_110;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = uStack_108;
    auVar110._8_8_ = 0;
    auVar110._0_8_ = uVar186;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uStack_100;
    auVar111._8_8_ = 0;
    auVar111._0_8_ = uStack_100;
    auVar24 = auVar35 * auVar110 + auVar158 + auVar36 * auVar111;
    uVar188 = auVar24._0_8_;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = uVar188 & 0xfffffffffffff;
    auVar23 = auVar34 * auVar109 + auVar157 + auVar37 * ZEXT816(0x1000003d10);
    uVar189 = auVar23._0_8_;
    auVar160._8_8_ = 0;
    auVar160._0_8_ = uVar188 >> 0x34 | auVar24._8_8_ << 0xc;
    auStack_178._56_8_ = uVar189 & 0xfffffffffffff;
    auVar159._8_8_ = 0;
    auVar159._0_8_ = uVar189 >> 0x34 | auVar23._8_8_ << 0xc;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = auStack_178._96_8_ * 2;
    auVar112._8_8_ = 0;
    auVar112._0_8_ = uStack_108;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uStack_110;
    auVar113._8_8_ = 0;
    auVar113._0_8_ = uStack_110;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = uStack_100;
    auVar114._8_8_ = 0;
    auVar114._0_8_ = uVar186;
    auVar160 = auVar40 * auVar114 + auVar160;
    uVar186 = auVar160._0_8_;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = uVar186 & 0xfffffffffffff;
    auVar23 = auVar38 * auVar112 + auVar159 + auVar39 * auVar113 + auVar41 * ZEXT816(0x1000003d10);
    uVar188 = auVar23._0_8_;
    auStack_178._64_8_ = uVar188 & 0xfffffffffffff;
    auVar161._8_8_ = 0;
    auVar161._0_8_ = (uVar188 >> 0x34 | auVar23._8_8_ << 0xc) + auStack_1e8._0_8_;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = uVar186 >> 0x34 | auVar160._8_8_ << 0xc;
    auVar161 = auVar42 * ZEXT816(0x1000003d10) + auVar161;
    uVar186 = auVar161._0_8_;
    auStack_178._72_8_ = uVar186 & 0xfffffffffffff;
    auStack_178._80_8_ = (uVar186 >> 0x34 | auVar161._8_8_ << 0xc) + auStack_248._48_8_;
    auStack_178._88_4_ = 1;
    auStack_178._92_4_ = 0;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_178 + 0x30));
    auStack_1e8._0_8_ = (a_01->x).n[0];
    auStack_1e8._8_8_ = (a_01->x).n[1];
    auStack_1e8._16_8_ = (a_01->x).n[2];
    auStack_1e8._24_8_ = (a_01->x).n[3];
    auStack_1e8._32_8_ = (a_01->x).n[4];
    auStack_1e8._40_4_ = (a_01->x).magnitude;
    auStack_1e8._44_4_ = (a_01->x).normalized;
    a_03 = (secp256k1_gej *)auStack_1e8;
    secp256k1_fe_verify((secp256k1_fe *)a_03);
    uVar186 = ((ulong)auStack_1e8._32_8_ >> 0x30) * 0x1000003d1 + auStack_1e8._0_8_;
    uVar188 = (uVar186 >> 0x34) + auStack_1e8._8_8_;
    uVar189 = (uVar188 >> 0x34) + auStack_1e8._16_8_;
    uVar187 = (uVar189 >> 0x34) + auStack_1e8._24_8_;
    auStack_1e8._24_8_ = uVar187 & 0xfffffffffffff;
    auStack_1e8._32_8_ = (uVar187 >> 0x34) + (auStack_1e8._32_8_ & 0xffffffffffff);
    auStack_1e8._16_8_ = uVar189 & 0xfffffffffffff;
    auStack_1e8._8_8_ = uVar188 & 0xfffffffffffff;
    auStack_1e8._0_8_ = uVar186 & 0xfffffffffffff;
    auStack_1e8._40_4_ = 1;
    secp256k1_fe_verify((secp256k1_fe *)a_03);
    secp256k1_fe_mul((secp256k1_fe *)(auStack_248 + 0x30),&a_00->x,
                     (secp256k1_fe *)(auStack_178 + 0x30));
    auStack_248._0_8_ = (a_01->y).n[0];
    auStack_248._8_8_ = (a_01->y).n[1];
    auStack_248._16_8_ = (a_01->y).n[2];
    auStack_248._24_8_ = (a_01->y).n[3];
    auStack_248._32_8_ = (a_01->y).n[4];
    auStack_248._40_4_ = (a_01->y).magnitude;
    auStack_248._44_4_ = (a_01->y).normalized;
    secp256k1_fe_verify((secp256k1_fe *)auStack_248);
    uVar186 = ((ulong)auStack_248._32_8_ >> 0x30) * 0x1000003d1 + auStack_248._0_8_;
    uVar188 = (uVar186 >> 0x34) + auStack_248._8_8_;
    uVar189 = (uVar188 >> 0x34) + auStack_248._16_8_;
    uVar187 = (uVar189 >> 0x34) + auStack_248._24_8_;
    auStack_248._24_8_ = uVar187 & 0xfffffffffffff;
    auStack_248._32_8_ = (uVar187 >> 0x34) + (auStack_248._32_8_ & 0xffffffffffff);
    auStack_248._16_8_ = uVar189 & 0xfffffffffffff;
    auStack_248._8_8_ = uVar188 & 0xfffffffffffff;
    auStack_248._0_8_ = uVar186 & 0xfffffffffffff;
    auStack_248._40_4_ = 1;
    secp256k1_fe_verify((secp256k1_fe *)auStack_248);
    r = (secp256k1_gej *)auStack_178;
    secp256k1_fe_mul((secp256k1_fe *)r,&a_00->y,(secp256k1_fe *)(auStack_178 + 0x30));
    secp256k1_fe_mul((secp256k1_fe *)r,(secp256k1_fe *)r,(secp256k1_fe *)(auStack_178 + 0x60));
    secp256k1_fe_verify((secp256k1_fe *)a_03);
    if (1 < (int)auStack_1e8._40_4_) goto LAB_0015263f;
    auStack_2d8._96_8_ = 0x3ffffbfffff0bc - auStack_1e8._0_8_;
    uStack_270 = 0x3ffffffffffffc - auStack_1e8._8_8_;
    uStack_268 = 0x3ffffffffffffc - auStack_1e8._16_8_;
    uStack_260 = 0x3ffffffffffffc - auStack_1e8._24_8_;
    uStack_258 = 0x3fffffffffffc - auStack_1e8._32_8_;
    uStack_250 = 2;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_2d8 + 0x60));
    secp256k1_fe_verify((secp256k1_fe *)(auStack_2d8 + 0x60));
    a_03 = (secp256k1_gej *)(auStack_248 + 0x30);
    secp256k1_fe_verify((secp256k1_fe *)a_03);
    if (0x20 < iStack_1f0 + (int)uStack_250) goto LAB_00152644;
    auStack_2d8._96_8_ = auStack_2d8._96_8_ + auStack_248._48_8_;
    uStack_270 = uStack_270 + uStack_210;
    uStack_268 = uStack_268 + uStack_208;
    uStack_260 = uStack_260 + uStack_200;
    uStack_258 = uStack_258 + uStack_1f8;
    uStack_250 = (ulong)(uint)(iStack_1f0 + (int)uStack_250);
    secp256k1_fe_verify((secp256k1_fe *)(auStack_2d8 + 0x60));
    a_03 = (secp256k1_gej *)auStack_178;
    secp256k1_fe_verify((secp256k1_fe *)a_03);
    if (1 < (int)auStack_178._40_4_) goto LAB_00152649;
    auStack_2d8._48_8_ = 0x3ffffbfffff0bc - auStack_178._0_8_;
    auStack_2d8._56_8_ = 0x3ffffffffffffc - auStack_178._8_8_;
    auStack_2d8._64_8_ = 0x3ffffffffffffc - auStack_178._16_8_;
    auStack_2d8._72_8_ = 0x3ffffffffffffc - auStack_178._24_8_;
    auStack_2d8._80_8_ = 0x3fffffffffffc - auStack_178._32_8_;
    auStack_2d8._88_8_ = 2;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_2d8 + 0x30));
    secp256k1_fe_verify((secp256k1_fe *)(auStack_2d8 + 0x30));
    a_03 = (secp256k1_gej *)auStack_248;
    secp256k1_fe_verify((secp256k1_fe *)a_03);
    if (0x20 < (int)(auStack_248._40_4_ + auStack_2d8._88_4_)) goto LAB_0015264e;
    auStack_2d8._48_8_ = auStack_2d8._48_8_ + auStack_248._0_8_;
    auStack_2d8._56_8_ = auStack_2d8._56_8_ + auStack_248._8_8_;
    auStack_2d8._64_8_ = auStack_2d8._64_8_ + auStack_248._16_8_;
    auStack_2d8._72_8_ = auStack_2d8._72_8_ + auStack_248._24_8_;
    auStack_2d8._80_8_ = auStack_2d8._80_8_ + auStack_248._32_8_;
    auStack_2d8._92_4_ = 0;
    auStack_2d8._88_4_ = auStack_248._40_4_ + auStack_2d8._88_4_;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_2d8 + 0x30));
    secp256k1_fe_verify((secp256k1_fe *)(auStack_2d8 + 0x60));
    uVar186 = (uStack_258 >> 0x30) * 0x1000003d1 + auStack_2d8._96_8_;
    if (((uVar186 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar186 & 0xfffffffffffff) == 0)) {
      uVar188 = (uVar186 >> 0x34) + uStack_270;
      uVar189 = (uVar188 >> 0x34) + uStack_268;
      uVar187 = (uVar189 >> 0x34) + uStack_260;
      uVar190 = (uVar187 >> 0x34) + (uStack_258 & 0xffffffffffff);
      if ((((uVar188 | uVar186 | uVar189 | uVar187) & 0xfffffffffffff) == 0 && uVar190 == 0) ||
         ((uVar186 + 0x1000003d0 & uVar188 & uVar189 & uVar187 & (uVar190 ^ 0xf000000000000)) ==
          0xfffffffffffff)) {
        secp256k1_fe_verify((secp256k1_fe *)(auStack_2d8 + 0x30));
        uVar186 = ((ulong)auStack_2d8._80_8_ >> 0x30) * 0x1000003d1 + auStack_2d8._48_8_;
        if (((uVar186 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar186 & 0xfffffffffffff) == 0))
        {
          uVar188 = (uVar186 >> 0x34) + auStack_2d8._56_8_;
          uVar189 = (uVar188 >> 0x34) + auStack_2d8._64_8_;
          uVar187 = (uVar189 >> 0x34) + auStack_2d8._72_8_;
          uVar190 = (uVar187 >> 0x34) + (auStack_2d8._80_8_ & 0xffffffffffff);
          if ((((uVar188 | uVar186 | uVar189 | uVar187) & 0xfffffffffffff) == 0 && uVar190 == 0) ||
             ((uVar186 + 0x1000003d0 & uVar188 & uVar189 & uVar187 & (uVar190 ^ 0xf000000000000)) ==
              0xfffffffffffff)) {
            secp256k1_gej_double_var(psVar182,a_01,(secp256k1_fe *)0x0);
            return extraout_EAX_04;
          }
        }
        secp256k1_gej_set_infinity(psVar182);
        return extraout_EAX_03;
      }
    }
    psVar182->infinity = 0;
    a_03 = (secp256k1_gej *)(auStack_2d8 + 0x60);
    secp256k1_fe_mul(&psVar182->z,(secp256k1_fe *)a_02,(secp256k1_fe *)a_03);
    secp256k1_fe_verify((secp256k1_fe *)a_03);
    if (8 < (int)uStack_250) goto LAB_00152653;
    a_03 = (secp256k1_gej *)auStack_e8;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = auStack_2d8._96_8_ * 2;
    auVar115._8_8_ = 0;
    auVar115._0_8_ = uStack_260;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = uStack_270 * 2;
    auVar116._8_8_ = 0;
    auVar116._0_8_ = uStack_268;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = uStack_258;
    auVar117._8_8_ = 0;
    auVar117._0_8_ = uStack_258;
    uVar188 = SUB168(auVar45 * auVar117,0);
    auVar46._8_8_ = 0;
    auVar46._0_8_ = uVar188 & 0xfffffffffffff;
    auVar23 = auVar44 * auVar116 + auVar43 * auVar115 + auVar46 * ZEXT816(0x1000003d10);
    uVar186 = auVar23._0_8_;
    auStack_2d8._0_8_ = uVar186 & 0xfffffffffffff;
    auVar162._8_8_ = 0;
    auVar162._0_8_ = uVar186 >> 0x34 | auVar23._8_8_ << 0xc;
    uVar186 = uStack_258 * 2;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = auStack_2d8._96_8_;
    auVar118._8_8_ = 0;
    auVar118._0_8_ = uVar186;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = uStack_270 * 2;
    auVar119._8_8_ = 0;
    auVar119._0_8_ = uStack_260;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = uStack_268;
    auVar120._8_8_ = 0;
    auVar120._0_8_ = uStack_268;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = uVar188 >> 0x34 | SUB168(auVar45 * auVar117,8) << 0xc;
    auVar23 = auVar47 * auVar118 + auVar162 + auVar48 * auVar119 + auVar49 * auVar120 +
              auVar50 * ZEXT816(0x1000003d10);
    uVar188 = auVar23._0_8_;
    auVar163._8_8_ = 0;
    auVar163._0_8_ = uVar188 >> 0x34 | auVar23._8_8_ << 0xc;
    a_02 = (secp256k1_gej *)(uVar188 & 0xffffffffffff);
    auVar51._8_8_ = 0;
    auVar51._0_8_ = auStack_2d8._96_8_;
    auVar121._8_8_ = 0;
    auVar121._0_8_ = auStack_2d8._96_8_;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = uStack_270;
    auVar122._8_8_ = 0;
    auVar122._0_8_ = uVar186;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = uStack_268 * 2;
    auVar123._8_8_ = 0;
    auVar123._0_8_ = uStack_260;
    auVar23 = auVar52 * auVar122 + auVar163 + auVar53 * auVar123;
    uVar189 = auVar23._0_8_;
    auVar165._8_8_ = 0;
    auVar165._0_8_ = uVar189 >> 0x34 | auVar23._8_8_ << 0xc;
    auVar124._8_8_ = 0;
    auVar124._0_8_ = (uVar189 & 0xfffffffffffff) << 4 | (uVar188 & 0xfffffffffffff) >> 0x30;
    auVar23 = auVar51 * auVar121 + ZEXT816(0x1000003d1) * auVar124;
    uVar188 = auVar23._0_8_;
    auStack_e8._0_8_ = uVar188 & 0xfffffffffffff;
    auVar164._8_8_ = 0;
    auVar164._0_8_ = uVar188 >> 0x34 | auVar23._8_8_ << 0xc;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = auStack_2d8._96_8_ * 2;
    auVar125._8_8_ = 0;
    auVar125._0_8_ = uStack_270;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = uStack_268;
    auVar126._8_8_ = 0;
    auVar126._0_8_ = uVar186;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = uStack_260;
    auVar127._8_8_ = 0;
    auVar127._0_8_ = uStack_260;
    auVar24 = auVar55 * auVar126 + auVar165 + auVar56 * auVar127;
    uVar188 = auVar24._0_8_;
    auVar57._8_8_ = 0;
    auVar57._0_8_ = uVar188 & 0xfffffffffffff;
    auVar23 = auVar54 * auVar125 + auVar164 + auVar57 * ZEXT816(0x1000003d10);
    uVar189 = auVar23._0_8_;
    auVar167._8_8_ = 0;
    auVar167._0_8_ = uVar188 >> 0x34 | auVar24._8_8_ << 0xc;
    auStack_e8._8_8_ = uVar189 & 0xfffffffffffff;
    auVar166._8_8_ = 0;
    auVar166._0_8_ = uVar189 >> 0x34 | auVar23._8_8_ << 0xc;
    auVar58._8_8_ = 0;
    auVar58._0_8_ = auStack_2d8._96_8_ * 2;
    auVar128._8_8_ = 0;
    auVar128._0_8_ = uStack_268;
    auVar59._8_8_ = 0;
    auVar59._0_8_ = uStack_270;
    auVar129._8_8_ = 0;
    auVar129._0_8_ = uStack_270;
    auVar60._8_8_ = 0;
    auVar60._0_8_ = uStack_260;
    auVar130._8_8_ = 0;
    auVar130._0_8_ = uVar186;
    auVar167 = auVar60 * auVar130 + auVar167;
    uVar186 = auVar167._0_8_;
    auVar61._8_8_ = 0;
    auVar61._0_8_ = uVar186 & 0xfffffffffffff;
    auVar23 = auVar58 * auVar128 + auVar166 + auVar59 * auVar129 + auVar61 * ZEXT816(0x1000003d10);
    uVar188 = auVar23._0_8_;
    auStack_e8._16_8_ = uVar188 & 0xfffffffffffff;
    auVar168._8_8_ = 0;
    auVar168._0_8_ = (uVar188 >> 0x34 | auVar23._8_8_ << 0xc) + auStack_2d8._0_8_;
    auVar62._8_8_ = 0;
    auVar62._0_8_ = uVar186 >> 0x34 | auVar167._8_8_ << 0xc;
    auVar168 = auVar62 * ZEXT816(0x1000003d10) + auVar168;
    uVar186 = auVar168._0_8_;
    auStack_e8._24_8_ = uVar186 & 0xfffffffffffff;
    auStack_e8._32_8_ = (long)(a_02->x).n + (uVar186 >> 0x34 | auVar168._8_8_ << 0xc);
    auStack_e8._40_4_ = 1;
    auStack_e8._44_4_ = 0;
    auStack_1e8._48_8_ = a_02;
    secp256k1_fe_verify((secp256k1_fe *)a_03);
    secp256k1_fe_verify((secp256k1_fe *)a_03);
    if (1 < (int)auStack_e8._40_4_) goto LAB_00152658;
    auStack_e8._0_8_ = 0x3ffffbfffff0bc - auStack_e8._0_8_;
    auStack_e8._8_8_ = 0x3ffffffffffffc - auStack_e8._8_8_;
    auStack_e8._16_8_ = 0x3ffffffffffffc - auStack_e8._16_8_;
    auStack_e8._24_8_ = 0x3ffffffffffffc - auStack_e8._24_8_;
    auStack_e8._32_8_ = 0x3fffffffffffc - auStack_e8._32_8_;
    auStack_e8._40_4_ = 2;
    auStack_e8._44_4_ = 0;
    secp256k1_fe_verify((secp256k1_fe *)auStack_e8);
    secp256k1_fe_mul((secp256k1_fe *)auStack_2d8,(secp256k1_fe *)auStack_e8,
                     (secp256k1_fe *)(auStack_2d8 + 0x60));
    a_02 = (secp256k1_gej *)auStack_1e8;
    secp256k1_fe_mul((secp256k1_fe *)(auStack_1e8 + 0x30),(secp256k1_fe *)a_02,
                     (secp256k1_fe *)auStack_e8);
    secp256k1_fe_verify((secp256k1_fe *)(auStack_2d8 + 0x30));
    a_03 = psVar182;
    if (8 < (int)auStack_2d8._88_4_) goto LAB_0015265d;
    auVar63._8_8_ = 0;
    auVar63._0_8_ = auStack_2d8._48_8_ * 2;
    auVar131._8_8_ = 0;
    auVar131._0_8_ = auStack_2d8._72_8_;
    auVar64._8_8_ = 0;
    auVar64._0_8_ = auStack_2d8._56_8_ * 2;
    auVar132._8_8_ = 0;
    auVar132._0_8_ = auStack_2d8._64_8_;
    auVar65._8_8_ = 0;
    auVar65._0_8_ = auStack_2d8._80_8_;
    auVar133._8_8_ = 0;
    auVar133._0_8_ = auStack_2d8._80_8_;
    uVar188 = SUB168(auVar65 * auVar133,0);
    auVar66._8_8_ = 0;
    auVar66._0_8_ = uVar188 & 0xfffffffffffff;
    auVar23 = auVar64 * auVar132 + auVar63 * auVar131 + auVar66 * ZEXT816(0x1000003d10);
    uVar189 = auVar23._0_8_;
    auVar169._8_8_ = 0;
    auVar169._0_8_ = uVar189 >> 0x34 | auVar23._8_8_ << 0xc;
    uVar186 = auStack_2d8._80_8_ * 2;
    auVar67._8_8_ = 0;
    auVar67._0_8_ = auStack_2d8._48_8_;
    auVar134._8_8_ = 0;
    auVar134._0_8_ = uVar186;
    auVar68._8_8_ = 0;
    auVar68._0_8_ = auStack_2d8._56_8_ * 2;
    auVar135._8_8_ = 0;
    auVar135._0_8_ = auStack_2d8._72_8_;
    auVar69._8_8_ = 0;
    auVar69._0_8_ = auStack_2d8._64_8_;
    auVar136._8_8_ = 0;
    auVar136._0_8_ = auStack_2d8._64_8_;
    auVar70._8_8_ = 0;
    auVar70._0_8_ = uVar188 >> 0x34 | SUB168(auVar65 * auVar133,8) << 0xc;
    auVar23 = auVar67 * auVar134 + auVar169 + auVar68 * auVar135 + auVar69 * auVar136 +
              auVar70 * ZEXT816(0x1000003d10);
    uVar188 = auVar23._0_8_;
    auVar170._8_8_ = 0;
    auVar170._0_8_ = uVar188 >> 0x34 | auVar23._8_8_ << 0xc;
    uStack_188 = (uVar188 & 0xfffffffffffff) >> 0x30;
    a_02 = (secp256k1_gej *)(uVar188 & 0xffffffffffff);
    auVar71._8_8_ = 0;
    auVar71._0_8_ = auStack_2d8._48_8_;
    auVar137._8_8_ = 0;
    auVar137._0_8_ = auStack_2d8._48_8_;
    auVar72._8_8_ = 0;
    auVar72._0_8_ = auStack_2d8._56_8_;
    auVar138._8_8_ = 0;
    auVar138._0_8_ = uVar186;
    auVar73._8_8_ = 0;
    auVar73._0_8_ = auStack_2d8._64_8_ * 2;
    auVar139._8_8_ = 0;
    auVar139._0_8_ = auStack_2d8._72_8_;
    auVar23 = auVar72 * auVar138 + auVar170 + auVar73 * auVar139;
    uVar188 = auVar23._0_8_;
    auVar172._8_8_ = 0;
    auVar172._0_8_ = uVar188 >> 0x34 | auVar23._8_8_ << 0xc;
    auVar140._8_8_ = 0;
    auVar140._0_8_ = (uVar188 & 0xfffffffffffff) << 4 | uStack_188;
    auVar23 = auVar71 * auVar137 + ZEXT816(0x1000003d1) * auVar140;
    uVar188 = auVar23._0_8_;
    (psVar182->x).n[0] = uVar188 & 0xfffffffffffff;
    auVar171._8_8_ = 0;
    auVar171._0_8_ = uVar188 >> 0x34 | auVar23._8_8_ << 0xc;
    auVar74._8_8_ = 0;
    auVar74._0_8_ = auStack_2d8._48_8_ * 2;
    auVar141._8_8_ = 0;
    auVar141._0_8_ = auStack_2d8._56_8_;
    auVar75._8_8_ = 0;
    auVar75._0_8_ = auStack_2d8._64_8_;
    auVar142._8_8_ = 0;
    auVar142._0_8_ = uVar186;
    auVar76._8_8_ = 0;
    auVar76._0_8_ = auStack_2d8._72_8_;
    auVar143._8_8_ = 0;
    auVar143._0_8_ = auStack_2d8._72_8_;
    auVar24 = auVar75 * auVar142 + auVar172 + auVar76 * auVar143;
    uVar188 = auVar24._0_8_;
    auVar77._8_8_ = 0;
    auVar77._0_8_ = uVar188 & 0xfffffffffffff;
    auVar23 = auVar74 * auVar141 + auVar171 + auVar77 * ZEXT816(0x1000003d10);
    uVar187 = auVar23._0_8_;
    auVar174._8_8_ = 0;
    auVar174._0_8_ = uVar188 >> 0x34 | auVar24._8_8_ << 0xc;
    (psVar182->x).n[1] = uVar187 & 0xfffffffffffff;
    auVar173._8_8_ = 0;
    auVar173._0_8_ = uVar187 >> 0x34 | auVar23._8_8_ << 0xc;
    auVar78._8_8_ = 0;
    auVar78._0_8_ = auStack_2d8._48_8_ * 2;
    auVar144._8_8_ = 0;
    auVar144._0_8_ = auStack_2d8._64_8_;
    auVar79._8_8_ = 0;
    auVar79._0_8_ = auStack_2d8._56_8_;
    auVar145._8_8_ = 0;
    auVar145._0_8_ = auStack_2d8._56_8_;
    auVar80._8_8_ = 0;
    auVar80._0_8_ = auStack_2d8._72_8_;
    auVar146._8_8_ = 0;
    auVar146._0_8_ = uVar186;
    auVar174 = auVar80 * auVar146 + auVar174;
    uVar186 = auVar174._0_8_;
    auVar81._8_8_ = 0;
    auVar81._0_8_ = uVar186 & 0xfffffffffffff;
    auVar23 = auVar78 * auVar144 + auVar173 + auVar79 * auVar145 + auVar81 * ZEXT816(0x1000003d10);
    uVar188 = auVar23._0_8_;
    (psVar182->x).n[2] = uVar188 & 0xfffffffffffff;
    auVar175._8_8_ = 0;
    auVar175._0_8_ = (uVar188 >> 0x34 | auVar23._8_8_ << 0xc) + (uVar189 & 0xfffffffffffff);
    auVar82._8_8_ = 0;
    auVar82._0_8_ = uVar186 >> 0x34 | auVar174._8_8_ << 0xc;
    auVar175 = auVar82 * ZEXT816(0x1000003d10) + auVar175;
    uVar186 = auVar175._0_8_;
    (psVar182->x).n[3] = uVar186 & 0xfffffffffffff;
    (psVar182->x).n[4] = (long)(a_02->x).n + (uVar186 >> 0x34 | auVar175._8_8_ << 0xc);
    (psVar182->x).magnitude = 1;
    (psVar182->x).normalized = 0;
    psStack_180 = a_02;
    secp256k1_fe_verify(&psVar182->x);
    secp256k1_fe_verify(&psVar182->x);
    a_03 = (secp256k1_gej *)auStack_2d8;
    secp256k1_fe_verify((secp256k1_fe *)a_03);
    iVar180 = auStack_2d8._40_4_ + (psVar182->x).magnitude;
    if (0x20 < iVar180) goto LAB_00152662;
    uVar176 = (psVar182->x).n[1];
    uVar177 = (psVar182->x).n[2];
    uVar178 = (psVar182->x).n[3];
    (psVar182->x).n[0] = (psVar182->x).n[0] + auStack_2d8._0_8_;
    (psVar182->x).n[1] = uVar176 + auStack_2d8._8_8_;
    (psVar182->x).n[2] = uVar177 + auStack_2d8._16_8_;
    (psVar182->x).n[3] = uVar178 + auStack_2d8._24_8_;
    puVar1 = (psVar182->x).n + 4;
    *puVar1 = *puVar1 + auStack_2d8._32_8_;
    (psVar182->x).magnitude = iVar180;
    (psVar182->x).normalized = 0;
    secp256k1_fe_verify(&psVar182->x);
    secp256k1_fe_verify(&psVar182->x);
    a_03 = (secp256k1_gej *)(auStack_1e8 + 0x30);
    secp256k1_fe_verify((secp256k1_fe *)a_03);
    iVar180 = iStack_190 + (psVar182->x).magnitude;
    if (0x20 < iVar180) goto LAB_00152667;
    uVar176 = (psVar182->x).n[1];
    uVar177 = (psVar182->x).n[2];
    uVar178 = (psVar182->x).n[3];
    a_03 = (secp256k1_gej *)(auStack_1e8 + 0x30);
    (psVar182->x).n[0] = (long)((secp256k1_fe *)auStack_1e8._48_8_)->n + (psVar182->x).n[0];
    (psVar182->x).n[1] = uVar176 + uStack_1b0;
    (psVar182->x).n[2] = uVar177 + uStack_1a8;
    (psVar182->x).n[3] = uVar178 + uStack_1a0;
    puVar1 = (psVar182->x).n + 4;
    *puVar1 = *puVar1 + uStack_198;
    (psVar182->x).magnitude = iVar180;
    (psVar182->x).normalized = 0;
    secp256k1_fe_verify(&psVar182->x);
    secp256k1_fe_verify(&psVar182->x);
    secp256k1_fe_verify((secp256k1_fe *)a_03);
    iVar180 = iStack_190 + (psVar182->x).magnitude;
    if (0x20 < iVar180) goto LAB_0015266c;
    uVar176 = (psVar182->x).n[1];
    uVar177 = (psVar182->x).n[2];
    uVar178 = (psVar182->x).n[3];
    (psVar182->x).n[0] = (long)((secp256k1_fe *)auStack_1e8._48_8_)->n + (psVar182->x).n[0];
    (psVar182->x).n[1] = uVar176 + uStack_1b0;
    (psVar182->x).n[2] = uVar177 + uStack_1a8;
    (psVar182->x).n[3] = uVar178 + uStack_1a0;
    puVar1 = (psVar182->x).n + 4;
    *puVar1 = *puVar1 + uStack_198;
    (psVar182->x).magnitude = iVar180;
    (psVar182->x).normalized = 0;
    secp256k1_fe_verify(&psVar182->x);
    secp256k1_fe_verify((secp256k1_fe *)(auStack_1e8 + 0x30));
    a_03 = psVar182;
    secp256k1_fe_verify(&psVar182->x);
    iVar180 = (psVar182->x).magnitude + iStack_190;
    if (0x20 < iVar180) goto LAB_00152671;
    auStack_1e8._48_8_ = (long)((secp256k1_fe *)auStack_1e8._48_8_)->n + (psVar182->x).n[0];
    uStack_1b0 = (psVar182->x).n[1] + uStack_1b0;
    uStack_1a8 = (psVar182->x).n[2] + uStack_1a8;
    uStack_1a0 = (psVar182->x).n[3] + uStack_1a0;
    uStack_198 = uStack_198 + (psVar182->x).n[4];
    iStack_18c = 0;
    iStack_190 = iVar180;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_1e8 + 0x30));
    psVar2 = &psVar182->y;
    secp256k1_fe_mul(psVar2,(secp256k1_fe *)(auStack_1e8 + 0x30),
                     (secp256k1_fe *)(auStack_2d8 + 0x30));
    a_03 = (secp256k1_gej *)auStack_2d8;
    a_02 = a_03;
    secp256k1_fe_mul((secp256k1_fe *)a_03,(secp256k1_fe *)a_03,(secp256k1_fe *)auStack_248);
    secp256k1_fe_verify(psVar2);
    secp256k1_fe_verify((secp256k1_fe *)a_03);
    iVar180 = auStack_2d8._40_4_ + (psVar182->y).magnitude;
    if (iVar180 < 0x21) {
      uVar176 = (psVar182->y).n[1];
      uVar177 = (psVar182->y).n[2];
      uVar178 = (psVar182->y).n[3];
      (psVar182->y).n[0] = (psVar182->y).n[0] + auStack_2d8._0_8_;
      (psVar182->y).n[1] = uVar176 + auStack_2d8._8_8_;
      (psVar182->y).n[2] = uVar177 + auStack_2d8._16_8_;
      (psVar182->y).n[3] = uVar178 + auStack_2d8._24_8_;
      puVar1 = (psVar182->y).n + 4;
      *puVar1 = *puVar1 + auStack_2d8._32_8_;
      (psVar182->y).magnitude = iVar180;
      (psVar182->y).normalized = 0;
      secp256k1_fe_verify(psVar2);
      secp256k1_gej_verify(psVar182);
      return extraout_EAX_02;
    }
  }
  else {
    psVar182->infinity = a_00->infinity;
    a_03 = psVar181;
    secp256k1_fe_verify(&psVar181->x);
    if ((psVar181->x).magnitude < 9) {
      psVar2 = (secp256k1_fe *)(auStack_178 + 0x60);
      uVar186 = (psVar181->x).n[0];
      uVar188 = (psVar181->x).n[1];
      uVar189 = (psVar181->x).n[2];
      uVar187 = (psVar181->x).n[3];
      uVar190 = (psVar181->x).n[4];
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar186 * 2;
      auVar83._8_8_ = 0;
      auVar83._0_8_ = uVar187;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar188 * 2;
      auVar84._8_8_ = 0;
      auVar84._0_8_ = uVar189;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar190;
      auVar85._8_8_ = 0;
      auVar85._0_8_ = uVar190;
      uVar183 = SUB168(auVar5 * auVar85,0);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar183 & 0xfffffffffffff;
      auVar23 = auVar4 * auVar84 + auVar3 * auVar83 + auVar6 * ZEXT816(0x1000003d10);
      uVar185 = auVar23._0_8_;
      auStack_178._48_8_ = uVar185 & 0xfffffffffffff;
      auVar148._8_8_ = 0;
      auVar148._0_8_ = uVar185 >> 0x34 | auVar23._8_8_ << 0xc;
      uVar190 = uVar190 * 2;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar186;
      auVar86._8_8_ = 0;
      auVar86._0_8_ = uVar190;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uVar188 * 2;
      auVar87._8_8_ = 0;
      auVar87._0_8_ = uVar187;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = uVar189;
      auVar88._8_8_ = 0;
      auVar88._0_8_ = uVar189;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = uVar183 >> 0x34 | SUB168(auVar5 * auVar85,8) << 0xc;
      auVar23 = auVar7 * auVar86 + auVar148 + auVar8 * auVar87 + auVar9 * auVar88 +
                auVar10 * ZEXT816(0x1000003d10);
      uVar183 = auVar23._0_8_;
      auVar149._8_8_ = 0;
      auVar149._0_8_ = uVar183 >> 0x34 | auVar23._8_8_ << 0xc;
      auStack_248._48_8_ = (uVar183 & 0xfffffffffffff) >> 0x30;
      auStack_1e8._0_8_ = uVar183 & 0xffffffffffff;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = uVar186;
      auVar89._8_8_ = 0;
      auVar89._0_8_ = uVar186;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = uVar188;
      auVar90._8_8_ = 0;
      auVar90._0_8_ = uVar190;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = uVar189 * 2;
      auVar91._8_8_ = 0;
      auVar91._0_8_ = uVar187;
      auVar23 = auVar12 * auVar90 + auVar149 + auVar13 * auVar91;
      uVar183 = auVar23._0_8_;
      auVar151._8_8_ = 0;
      auVar151._0_8_ = uVar183 >> 0x34 | auVar23._8_8_ << 0xc;
      auVar92._8_8_ = 0;
      auVar92._0_8_ = (uVar183 & 0xfffffffffffff) << 4 | auStack_248._48_8_;
      auVar23 = auVar11 * auVar89 + ZEXT816(0x1000003d1) * auVar92;
      uVar183 = auVar23._0_8_;
      auStack_178._96_8_ = uVar183 & 0xfffffffffffff;
      auVar150._8_8_ = 0;
      auVar150._0_8_ = uVar183 >> 0x34 | auVar23._8_8_ << 0xc;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = uVar186 * 2;
      auVar93._8_8_ = 0;
      auVar93._0_8_ = uVar188;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = uVar189;
      auVar94._8_8_ = 0;
      auVar94._0_8_ = uVar190;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = uVar187;
      auVar95._8_8_ = 0;
      auVar95._0_8_ = uVar187;
      auVar24 = auVar15 * auVar94 + auVar151 + auVar16 * auVar95;
      uVar183 = auVar24._0_8_;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = uVar183 & 0xfffffffffffff;
      auVar23 = auVar14 * auVar93 + auVar150 + auVar17 * ZEXT816(0x1000003d10);
      uVar185 = auVar23._0_8_;
      auVar153._8_8_ = 0;
      auVar153._0_8_ = uVar183 >> 0x34 | auVar24._8_8_ << 0xc;
      uStack_110 = uVar185 & 0xfffffffffffff;
      auVar152._8_8_ = 0;
      auVar152._0_8_ = uVar185 >> 0x34 | auVar23._8_8_ << 0xc;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = uVar186 * 2;
      auVar96._8_8_ = 0;
      auVar96._0_8_ = uVar189;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = uVar188;
      auVar97._8_8_ = 0;
      auVar97._0_8_ = uVar188;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = uVar187;
      auVar98._8_8_ = 0;
      auVar98._0_8_ = uVar190;
      auVar153 = auVar20 * auVar98 + auVar153;
      uVar186 = auVar153._0_8_;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = uVar186 & 0xfffffffffffff;
      auVar23 = auVar18 * auVar96 + auVar152 + auVar19 * auVar97 + auVar21 * ZEXT816(0x1000003d10);
      uVar188 = auVar23._0_8_;
      uStack_108 = uVar188 & 0xfffffffffffff;
      auVar154._8_8_ = 0;
      auVar154._0_8_ = (uVar188 >> 0x34 | auVar23._8_8_ << 0xc) + auStack_178._48_8_;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = uVar186 >> 0x34 | auVar153._8_8_ << 0xc;
      auVar154 = auVar22 * ZEXT816(0x1000003d10) + auVar154;
      uVar186 = auVar154._0_8_;
      uStack_100 = uVar186 & 0xfffffffffffff;
      uStack_f8 = (uVar186 >> 0x34 | auVar154._8_8_ << 0xc) + auStack_1e8._0_8_;
      uStack_f0._0_4_ = 1;
      uStack_f0._4_4_ = 0;
      secp256k1_fe_verify(psVar2);
      secp256k1_fe_mul((secp256k1_fe *)(auStack_178 + 0x30),psVar2,&psVar181->x);
      secp256k1_fe_mul(&psVar182->x,&a_00->x,psVar2);
      secp256k1_fe_mul(&psVar182->y,&a_00->y,(secp256k1_fe *)(auStack_178 + 0x30));
      (psVar182->z).n[0] = 1;
      (psVar182->z).n[1] = 0;
      (psVar182->z).n[2] = 0;
      (psVar182->z).n[3] = 0;
      (psVar182->z).n[4] = 0;
      (psVar182->z).magnitude = 1;
      (psVar182->z).normalized = 1;
      secp256k1_fe_verify(&psVar182->z);
      return extraout_EAX_01;
    }
    secp256k1_gej_add_zinv_var_cold_1();
LAB_0015263a:
    secp256k1_gej_add_zinv_var_cold_14();
LAB_0015263f:
    secp256k1_gej_add_zinv_var_cold_13();
LAB_00152644:
    secp256k1_gej_add_zinv_var_cold_12();
LAB_00152649:
    secp256k1_gej_add_zinv_var_cold_11();
LAB_0015264e:
    a_02 = r;
    secp256k1_gej_add_zinv_var_cold_10();
LAB_00152653:
    secp256k1_gej_add_zinv_var_cold_9();
LAB_00152658:
    secp256k1_gej_add_zinv_var_cold_8();
LAB_0015265d:
    secp256k1_gej_add_zinv_var_cold_7();
LAB_00152662:
    secp256k1_gej_add_zinv_var_cold_6();
LAB_00152667:
    secp256k1_gej_add_zinv_var_cold_5();
LAB_0015266c:
    secp256k1_gej_add_zinv_var_cold_4();
LAB_00152671:
    secp256k1_gej_add_zinv_var_cold_3();
  }
  secp256k1_gej_add_zinv_var_cold_2();
  if (extraout_EDX < 0x20) {
    uVar191 = (uint)a_02;
    if (0x100 < extraout_EDX + uVar191) goto LAB_001526e3;
    uVar186 = (ulong)a_02 >> 6 & 0x3ffffff;
    if ((extraout_EDX + uVar191) - 1 >> 6 != (uint)uVar186) {
      if (uVar191 < 0xc0) {
        bVar147 = (byte)a_02 & 0x3f;
        uVar191 = (uint)((a_03->x).n[uVar186] >> bVar147) |
                  (uint)((a_03->x).n[uVar186 + 1] << 0x40 - bVar147);
        goto LAB_001526cc;
      }
      goto LAB_001526ed;
    }
    if ((extraout_EDX + uVar191) - 1 >> 6 == (uint)uVar186) {
      uVar191 = (uint)((a_03->x).n[uVar186] >> ((byte)a_02 & 0x3f));
LAB_001526cc:
      return uVar191 & ~(uint)(-1L << ((byte)extraout_EDX & 0x3f));
    }
  }
  else {
    secp256k1_scalar_get_bits_var_cold_4();
LAB_001526e3:
    secp256k1_scalar_get_bits_var_cold_3();
  }
  secp256k1_scalar_get_bits_var_cold_2();
LAB_001526ed:
  secp256k1_scalar_get_bits_var_cold_1();
  *(undefined4 *)(a_03->z).n = 1;
  (a_03->x).magnitude = 0;
  (a_03->x).normalized = 1;
  (a_03->x).n[0] = 0;
  (a_03->x).n[1] = 0;
  (a_03->x).n[2] = 0;
  (a_03->x).n[3] = 0;
  (a_03->x).n[4] = 0;
  secp256k1_fe_verify(&a_03->x);
  (a_03->y).magnitude = 0;
  (a_03->y).normalized = 1;
  (a_03->y).n[0] = 0;
  (a_03->y).n[1] = 0;
  (a_03->y).n[2] = 0;
  (a_03->y).n[3] = 0;
  (a_03->y).n[4] = 0;
  secp256k1_fe_verify(&a_03->y);
  secp256k1_ge_verify((secp256k1_ge *)a_03);
  return extraout_EAX_05;
}

Assistant:

static int secp256k1_ecmult_wnaf(int *wnaf, int len, const secp256k1_scalar *a, int w) {
    secp256k1_scalar s;
    int last_set_bit = -1;
    int bit = 0;
    int sign = 1;
    int carry = 0;

    VERIFY_CHECK(wnaf != NULL);
    VERIFY_CHECK(0 <= len && len <= 256);
    VERIFY_CHECK(a != NULL);
    VERIFY_CHECK(2 <= w && w <= 31);

    memset(wnaf, 0, len * sizeof(wnaf[0]));

    s = *a;
    if (secp256k1_scalar_get_bits(&s, 255, 1)) {
        secp256k1_scalar_negate(&s, &s);
        sign = -1;
    }

    while (bit < len) {
        int now;
        int word;
        if (secp256k1_scalar_get_bits(&s, bit, 1) == (unsigned int)carry) {
            bit++;
            continue;
        }

        now = w;
        if (now > len - bit) {
            now = len - bit;
        }

        word = secp256k1_scalar_get_bits_var(&s, bit, now) + carry;

        carry = (word >> (w-1)) & 1;
        word -= carry << w;

        wnaf[bit] = sign * word;
        last_set_bit = bit;

        bit += now;
    }
#ifdef VERIFY
    {
        int verify_bit = bit;

        VERIFY_CHECK(carry == 0);

        while (verify_bit < 256) {
            VERIFY_CHECK(secp256k1_scalar_get_bits(&s, verify_bit, 1) == 0);
            verify_bit++;
        }
    }
#endif
    return last_set_bit + 1;
}